

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::ParseService(Parser *this,char *filename)

{
  StructDef *pSVar1;
  StructDef *pSVar2;
  bool bVar3;
  ServiceDef *this_00;
  RPCCall *e;
  char *in_RDX;
  CheckedError *ce;
  int t;
  Namespace *this_01;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  allocator<char> local_111;
  string rpc_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  doc_comment;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  string *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  int local_88 [2];
  undefined2 uStack_80;
  undefined6 uStack_7e;
  undefined2 uStack_78;
  undefined8 uStack_76;
  string service_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  service_comment;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&service_comment,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(filename + 0x48));
  Next(this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    CheckedError::~CheckedError((CheckedError *)this);
    local_b0 = (string *)(filename + 0x28);
    std::__cxx11::string::string((string *)&service_name,local_b0);
    t = (int)filename;
    local_b8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(filename + 0x48);
    Expect(this,t);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
      this_00 = (ServiceDef *)operator_new(0x110);
      memset(this_00,0,0x110);
      ServiceDef::ServiceDef(this_00);
      std::__cxx11::string::_M_assign((string *)this_00);
      std::__cxx11::string::_M_assign((string *)&(this_00->super_Definition).file);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(this_00->super_Definition).doc_comment,&service_comment);
      this_01 = *(Namespace **)(filename + 0x198);
      (this_00->super_Definition).defined_namespace = this_01;
      if ((in_RDX != (char *)0x0) && (*(long *)(filename + 0x628) != 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,in_RDX,(allocator<char> *)local_88);
        FilePath(&rpc_name,(string *)(filename + 0x620),&local_d8,(bool)filename[0x4e4]);
        pVar4 = std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)(filename + 0x748),&rpc_name);
        (this_00->super_Definition).declaration_file = (string *)(pVar4.first._M_node._M_node + 1);
        std::__cxx11::string::~string((string *)&rpc_name);
        std::__cxx11::string::~string((string *)&local_d8);
        this_01 = *(Namespace **)(filename + 0x198);
      }
      Namespace::GetFullyQualifiedName(&rpc_name,this_01,&service_name,1000);
      bVar3 = SymbolTable<flatbuffers::ServiceDef>::Add
                        ((SymbolTable<flatbuffers::ServiceDef> *)(filename + 0x138),&rpc_name,
                         this_00);
      std::__cxx11::string::~string((string *)&rpc_name);
      if (bVar3) {
        std::operator+(&rpc_name,"service already exists: ",&service_name);
        Error(this,(string *)filename);
        std::__cxx11::string::~string((string *)&rpc_name);
      }
      else {
        ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)filename);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            CheckedError::~CheckedError((CheckedError *)this);
            do {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&doc_comment,local_b8);
              std::__cxx11::string::string((string *)&rpc_name,local_b0);
              Expect(this,t);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') {
LAB_00112749:
                std::__cxx11::string::~string((string *)&rpc_name);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&doc_comment);
                goto LAB_0011275d;
              }
              CheckedError::~CheckedError((CheckedError *)this);
              Expect(this,t);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00112749;
              CheckedError::~CheckedError((CheckedError *)this);
              local_d8.field_2._M_allocated_capacity._0_2_ = 0;
              local_d8.field_2._2_8_ = 0;
              local_d8._M_dataplus._M_p = (pointer)0x0;
              local_d8._M_string_length._0_2_ = 0;
              local_d8._M_string_length._2_6_ = 0;
              uStack_78 = 0;
              uStack_76 = 0;
              local_88[0] = 0;
              local_88[1] = 0;
              uStack_80 = 0;
              uStack_7e = 0;
              ParseTypeIdent(this,(Type *)filename);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00112749;
              CheckedError::~CheckedError((CheckedError *)this);
              Expect(this,t);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00112749;
              CheckedError::~CheckedError((CheckedError *)this);
              Expect(this,t);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00112749;
              CheckedError::~CheckedError((CheckedError *)this);
              ParseTypeIdent(this,(Type *)filename);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00112749;
              CheckedError::~CheckedError((CheckedError *)this);
              if (((((int)local_d8._M_dataplus._M_p != 0xf) ||
                   (pSVar1 = (StructDef *)
                             CONCAT62(local_d8._M_string_length._2_6_,
                                      (undefined2)local_d8._M_string_length), pSVar1->fixed != false
                   )) || (local_88[0] != 0xf)) ||
                 (pSVar2 = (StructDef *)CONCAT62(uStack_7e,uStack_80), pSVar2->fixed == true)) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_a8,"rpc request and response types must be tables",
                           &local_111);
                Error(this,(string *)filename);
LAB_0011273f:
                std::__cxx11::string::~string((string *)&local_a8);
                goto LAB_00112749;
              }
              e = (RPCCall *)operator_new(0xd8);
              memset(e,0,0xd8);
              Definition::Definition((Definition *)e);
              std::__cxx11::string::_M_assign((string *)e);
              e->request = pSVar1;
              e->response = pSVar2;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=(&(e->super_Definition).doc_comment,&doc_comment);
              bVar3 = SymbolTable<flatbuffers::RPCCall>::Add(&this_00->calls,&rpc_name,e);
              if (bVar3) {
                std::operator+(&local_a8,"rpc already exists: ",&rpc_name);
                Error(this,(string *)filename);
                goto LAB_0011273f;
              }
              ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)filename);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00112749;
              CheckedError::~CheckedError((CheckedError *)this);
              Expect(this,t);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00112749;
              CheckedError::~CheckedError((CheckedError *)this);
              std::__cxx11::string::~string((string *)&rpc_name);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&doc_comment);
            } while (*(int *)(filename + 0x1c) != 0x7d);
            Next(this);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              CheckedError::~CheckedError((CheckedError *)this);
              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
            }
          }
        }
      }
    }
LAB_0011275d:
    std::__cxx11::string::~string((string *)&service_name);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&service_comment);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseService(const char *filename) {
  std::vector<std::string> service_comment = doc_comment_;
  NEXT();
  auto service_name = attribute_;
  EXPECT(kTokenIdentifier);
  auto &service_def = *new ServiceDef();
  service_def.name = service_name;
  service_def.file = file_being_parsed_;
  service_def.doc_comment = service_comment;
  service_def.defined_namespace = current_namespace_;
  if (filename != nullptr && !opts.project_root.empty()) {
    service_def.declaration_file =
        &GetPooledString(FilePath(opts.project_root, filename, opts.binary_schema_absolute_paths));
  }
  if (services_.Add(current_namespace_->GetFullyQualifiedName(service_name),
                    &service_def))
    return Error("service already exists: " + service_name);
  ECHECK(ParseMetaData(&service_def.attributes));
  EXPECT('{');
  do {
    std::vector<std::string> doc_comment = doc_comment_;
    auto rpc_name = attribute_;
    EXPECT(kTokenIdentifier);
    EXPECT('(');
    Type reqtype, resptype;
    ECHECK(ParseTypeIdent(reqtype));
    EXPECT(')');
    EXPECT(':');
    ECHECK(ParseTypeIdent(resptype));
    if (reqtype.base_type != BASE_TYPE_STRUCT || reqtype.struct_def->fixed ||
        resptype.base_type != BASE_TYPE_STRUCT || resptype.struct_def->fixed)
      return Error("rpc request and response types must be tables");
    auto &rpc = *new RPCCall();
    rpc.name = rpc_name;
    rpc.request = reqtype.struct_def;
    rpc.response = resptype.struct_def;
    rpc.doc_comment = doc_comment;
    if (service_def.calls.Add(rpc_name, &rpc))
      return Error("rpc already exists: " + rpc_name);
    ECHECK(ParseMetaData(&rpc.attributes));
    EXPECT(';');
  } while (token_ != '}');
  NEXT();
  return NoError();
}